

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite_tar.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  uint iMode;
  ulong uVar3;
  char *__s;
  byte bVar4;
  ulong uVar5;
  void *pMap;
  unqlite *pDb;
  unqlite_int64 nSize;
  unqlite_kv_cursor *local_48;
  unqlite *local_40;
  unqlite_int64 local_38;
  
  if ((2 < argc) && (*argv[2] == '-')) {
    bVar4 = argv[2][1] & 0xdf;
    uVar3 = (ulong)bVar4;
    iMode = 0x101;
    if (bVar4 == 0x57) {
      iMode = 4;
    }
    iVar2 = unqlite_open(&local_40,argv[1],iMode);
    if (iVar2 != 0) goto LAB_0010a72e;
    if (bVar4 == 0x57) {
      if (argc != 3) {
        uVar3 = (ulong)(uint)argc;
        uVar5 = 3;
        argc = 0x141012;
        do {
          pcVar1 = argv[uVar5];
          printf("Inserting %s\t ... ",pcVar1);
          iVar2 = unqlite_util_load_mmaped_file(pcVar1,&local_48,&local_38);
          __s = "Fail";
          if (iVar2 == 0) {
            iVar2 = unqlite_kv_store(local_40,pcVar1,-1,local_48,local_38);
            unqlite_util_release_mmaped_file(local_48,local_38);
            __s = "Fail";
            if (iVar2 == 0) {
              __s = "OK";
            }
          }
          puts(__s);
          uVar5 = uVar5 + 1;
        } while (uVar3 != uVar5);
      }
      bVar4 = (byte)uVar3;
      iVar2 = unqlite_commit(local_40);
      if (iVar2 == 0) goto LAB_0010a70e;
      iVar2 = unqlite_rollback(local_40);
      if (iVar2 == 0) goto LAB_0010a70e;
      Fatal(local_40,(char *)0x0);
    }
    if (bVar4 == 0x49) {
      iVar2 = unqlite_kv_cursor_init(local_40,&local_48);
      if (iVar2 != 0) goto LAB_0010a72e;
      unqlite_kv_cursor_first_entry(local_48);
      iVar2 = unqlite_kv_cursor_valid_entry(local_48);
      if (iVar2 != 0) {
        do {
          unqlite_kv_cursor_key_callback(local_48,DataConsumerCallback,(void *)0x0);
          unqlite_kv_cursor_data(local_48,(void *)0x0,&local_38);
          printf(":\t %ld Bytes\n",local_38);
          unqlite_kv_cursor_next_entry(local_48);
          iVar2 = unqlite_kv_cursor_valid_entry(local_48);
        } while (iVar2 != 0);
      }
      unqlite_kv_cursor_release(local_40,local_48);
    }
    else if (argc != 3) {
      uVar3 = 3;
      do {
        pcVar1 = argv[uVar3];
        iVar2 = unqlite_kv_fetch_callback(local_40,pcVar1,-1,DataConsumerCallback,(void *)0x0);
        if (iVar2 == -6) {
          printf("No such record: %s\n",pcVar1);
        }
        uVar3 = uVar3 + 1;
      } while ((uint)argc != uVar3);
    }
LAB_0010a70e:
    unqlite_close(local_40);
    return 0;
  }
  Help();
LAB_0010a72e:
  puts("Out of memory");
  unqlite_lib_shutdown();
  exit(0);
}

Assistant:

int main(int argc, char *argv[])
{
	int db_extract = 0;          /* TRUE to extract records from the dabase */
	int db_store = 0;            /* TRUE to store files in the database */
	int db_iterate = 0;          /* TRUE to iterate over the inserted elements */
	unqlite *pDb;                /* Database handle */
	int c, i, rc;

	if (argc < 3) {
		/* Missing database name */
		Help();
	}

	c = argv[2][0];
	if (c != '-') {
		/* Missing command */
		Help();
	}
	c = argv[2][1];
	if (c == 'i' || c == 'I') {
		/* Iterate over the inserted elements */
		db_iterate = 1;
	}
	else if (c == 'w' || c == 'W') {
		/* Store some files */
		db_store = 1;
	}
	else {
		/* Extract some records */
		db_extract = 1;
	}


	/* Open our database */
	rc = unqlite_open(&pDb, argv[1], db_store ? UNQLITE_OPEN_CREATE : (UNQLITE_OPEN_READONLY | UNQLITE_OPEN_MMAP) /* Read-only DB */);
	if (rc != UNQLITE_OK) {
		Fatal(0, "Out of memory");
	}

	if (db_store) {
		void *pMap;          /* Read-only memory view of the target file */
		unqlite_int64 nSize; /* file size */

		/* Start the insertion */
		for (i = 3; i < argc; ++i) {
			const char *zFile = argv[i];
			printf("Inserting %s\t ... ", zFile);

			/* Obtain a read-only memory view of the whole file */
			rc = unqlite_util_load_mmaped_file(zFile, &pMap, &nSize);
			if (rc == UNQLITE_OK) {
				/* Store the whole file */
				rc = unqlite_kv_store(pDb, zFile, -1, pMap, nSize);
				/* Discard this view */
				unqlite_util_release_mmaped_file(pMap, nSize);
			}
			puts(rc == UNQLITE_OK ? "OK" : "Fail");
		}
		/* Manually commit the transaction.
		 * In fact, a call to unqlite_commit() is not necessary since UnQLite
		 * will automatically commit the transaction during a call to unqlite_close().
		 */
		rc = unqlite_commit(pDb);
		if (rc != UNQLITE_OK) {
			/* Rollback the transaction */
			rc = unqlite_rollback(pDb);
		}
		if (rc != UNQLITE_OK) {
			/* Something goes wrong, extract the database error log and exit */
			Fatal(pDb, 0);
		}
	}
	else if (db_iterate) {
		/* Iterate over the inserted records */
		unqlite_kv_cursor *pCur;

		/* Allocate a new cursor instance */
		rc = unqlite_kv_cursor_init(pDb, &pCur);
		if (rc != UNQLITE_OK) {
			Fatal(0, "Out of memory");
		}

		/* Point to the first record */
		unqlite_kv_cursor_first_entry(pCur);

		/* Iterate over the entries */
		while (unqlite_kv_cursor_valid_entry(pCur)) {
			unqlite_int64 nDataLen;

			/* Consume the key */
			unqlite_kv_cursor_key_callback(pCur, DataConsumerCallback, 0);

			/* Extract the data size */
			unqlite_kv_cursor_data(pCur, 0, &nDataLen);
			printf(":\t %l"NUM_FORMAT"d Bytes\n", nDataLen);
			/* unqlite_kv_cursor_data_callback(pCur,DataConsumerCallback,0); */

			/* Point to the next entry */
			unqlite_kv_cursor_next_entry(pCur);
		}
		/* Finally, Release our cursor */
		unqlite_kv_cursor_release(pDb, pCur);
	}
	else {
		/* Extract one more records */
		for (i = 3; i < argc; ++i) {
			const char *zFile = argv[i];
			rc = unqlite_kv_fetch_callback(pDb, zFile, -1, DataConsumerCallback, 0);
			if (rc == UNQLITE_NOTFOUND) {
				printf("No such record: %s\n", zFile);
			}
		}
	}

	/* All done, close our database */
	unqlite_close(pDb);
	return 0;
}